

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start)

{
  IdxElement *pIVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int32_t iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  bool bVar25;
  type t;
  IdxElement local_118;
  IdxElement local_dc;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar21 = 2;
  do {
    iVar3 = SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
            ::incs[lVar21];
    lVar22 = (long)start + (long)iVar3;
    lVar24 = lVar22;
    iVar23 = start;
    if ((int)lVar22 <= end) {
      do {
        iVar4 = keys[lVar24].idx;
        uVar8 = *(undefined8 *)(keys[lVar24].val.m_backend.data._M_elems + 8);
        puVar2 = keys[lVar24].val.m_backend.data._M_elems + 4;
        uVar11 = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        uVar13 = *(undefined8 *)keys[lVar24].val.m_backend.data._M_elems;
        uVar14 = *(undefined8 *)(keys[lVar24].val.m_backend.data._M_elems + 2);
        iVar5 = keys[lVar24].val.m_backend.exp;
        bVar25 = keys[lVar24].val.m_backend.neg;
        fVar6 = keys[lVar24].val.m_backend.fpclass;
        iVar7 = keys[lVar24].val.m_backend.prec_elem;
        iVar20 = (int)lVar24;
        iVar10 = iVar23;
        if (lVar22 <= lVar24) {
          do {
            local_dc.idx = keys[iVar10].idx;
            local_dc.val.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 8);
            local_dc.val.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)keys[iVar10].val.m_backend.data._M_elems;
            local_dc.val.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 2);
            puVar2 = keys[iVar10].val.m_backend.data._M_elems + 4;
            local_dc.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_dc.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_dc.val.m_backend.exp = keys[iVar10].val.m_backend.exp;
            local_dc.val.m_backend.neg = keys[iVar10].val.m_backend.neg;
            local_dc.val.m_backend.fpclass = keys[iVar10].val.m_backend.fpclass;
            local_dc.val.m_backend.prec_elem = keys[iVar10].val.m_backend.prec_elem;
            local_118.idx = iVar4;
            local_118.val.m_backend.data._M_elems._0_8_ = uVar13;
            local_118.val.m_backend.data._M_elems._8_8_ = uVar14;
            local_118.val.m_backend.data._M_elems._16_8_ = uVar11;
            local_118.val.m_backend.data._M_elems._24_8_ = uVar12;
            local_118.val.m_backend.data._M_elems._32_8_ = uVar8;
            local_118.val.m_backend.exp = iVar5;
            local_118.val.m_backend.neg = bVar25;
            local_118.val.m_backend.fpclass = fVar6;
            local_118.val.m_backend.prec_elem = iVar7;
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxCompare::operator()
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a0,compare,&local_118,&local_dc);
            iVar20 = iVar10;
            if (local_a0.fpclass == cpp_dec_float_NaN) break;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_68,0,(type *)0x0);
            iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_a0,&local_68);
            if (-1 < iVar19) break;
            iVar20 = iVar3 + iVar10;
            pIVar1 = keys + iVar10;
            keys[iVar20].idx = pIVar1->idx;
            uVar15 = *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 2);
            uVar16 = *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 4);
            uVar17 = *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 6);
            *(undefined8 *)keys[iVar20].val.m_backend.data._M_elems =
                 *(undefined8 *)keys[iVar10].val.m_backend.data._M_elems;
            *(undefined8 *)(keys[iVar20].val.m_backend.data._M_elems + 2) = uVar15;
            puVar2 = keys[iVar20].val.m_backend.data._M_elems + 4;
            *(undefined8 *)puVar2 = uVar16;
            *(undefined8 *)(puVar2 + 2) = uVar17;
            *(undefined8 *)(keys[iVar20].val.m_backend.data._M_elems + 8) =
                 *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 8);
            keys[iVar20].val.m_backend.exp = (pIVar1->val).m_backend.exp;
            keys[iVar20].val.m_backend.neg = (pIVar1->val).m_backend.neg;
            iVar18 = (pIVar1->val).m_backend.prec_elem;
            keys[iVar20].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
            keys[iVar20].val.m_backend.prec_elem = iVar18;
            iVar20 = iVar10 - iVar3;
            bVar9 = (int)lVar22 <= iVar10;
            iVar10 = iVar20;
          } while (bVar9);
          iVar20 = iVar20 + iVar3;
        }
        keys[iVar20].idx = iVar4;
        *(undefined8 *)keys[iVar20].val.m_backend.data._M_elems = uVar13;
        *(undefined8 *)(keys[iVar20].val.m_backend.data._M_elems + 2) = uVar14;
        puVar2 = keys[iVar20].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar11;
        *(undefined8 *)(puVar2 + 2) = uVar12;
        *(undefined8 *)(keys[iVar20].val.m_backend.data._M_elems + 8) = uVar8;
        keys[iVar20].val.m_backend.exp = iVar5;
        keys[iVar20].val.m_backend.neg = bVar25;
        keys[iVar20].val.m_backend.fpclass = fVar6;
        keys[iVar20].val.m_backend.prec_elem = iVar7;
        lVar24 = lVar24 + 1;
        iVar23 = iVar23 + 1;
      } while (end + 1 != (int)lVar24);
    }
    bVar25 = lVar21 == 0;
    lVar21 = lVar21 + -1;
    if (bVar25) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}